

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void je_malloc_stats_print(_func_void_void_ptr_char_ptr *write_cb,void *cbopaque,char *opts)

{
  char *in_FS_OFFSET;
  
  if ((tsd_booted) && (*in_FS_OFFSET != '\0')) {
    tsd_fetch_slow(*(tsd_t **)in_FS_OFFSET,false);
  }
  stats_print(write_cb,cbopaque,opts);
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	tsdn_t *tsdn;

	LOG("core.malloc_stats_print.entry", "");

	tsdn = tsdn_fetch();
	check_entry_exit_locking(tsdn);
	stats_print(write_cb, cbopaque, opts);
	check_entry_exit_locking(tsdn);
	LOG("core.malloc_stats_print.exit", "");
}